

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall CoreML::Specification::BorderAmounts::Clear(BorderAmounts *this)

{
  uint32_t cached_has_bits;
  BorderAmounts *this_local;
  
  google::protobuf::RepeatedPtrField<CoreML::Specification::BorderAmounts_EdgeSizes>::Clear
            (&this->borderamounts_);
  google::protobuf::internal::InternalMetadata::Clear<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

void BorderAmounts::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.BorderAmounts)
  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  borderamounts_.Clear();
  _internal_metadata_.Clear<std::string>();
}